

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O0

void put_demapped_gray(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  JDIMENSION col;
  JSAMPROW color_map0;
  char *outptr;
  JSAMPROW inptr;
  tga_dest_ptr dest;
  int local_3c;
  undefined1 *local_30;
  byte *local_28;
  
  lVar1 = **(long **)(in_RDI + 0xa0);
  local_30 = *(undefined1 **)(in_RSI + 0x38);
  local_28 = (byte *)**(undefined8 **)(in_RSI + 0x28);
  for (local_3c = *(int *)(in_RDI + 0x88); local_3c != 0; local_3c = local_3c + -1) {
    *local_30 = *(undefined1 *)(lVar1 + (ulong)*local_28);
    local_30 = local_30 + 1;
    local_28 = local_28 + 1;
  }
  fwrite(*(void **)(in_RSI + 0x38),1,(ulong)*(uint *)(in_RSI + 0x40),*(FILE **)(in_RSI + 0x20));
  return;
}

Assistant:

METHODDEF(void)
put_demapped_gray(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                  JDIMENSION rows_supplied)
{
  tga_dest_ptr dest = (tga_dest_ptr)dinfo;
  register JSAMPROW inptr;
  register char *outptr;
  register JSAMPROW color_map0 = cinfo->colormap[0];
  register JDIMENSION col;

  inptr = dest->pub.buffer[0];
  outptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    *outptr++ = color_map0[*inptr++];
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}